

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack10_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  uVar1 = *in;
  *out = uVar1 & 0x3ff;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001ad330);
  auVar4._8_4_ = 0x3ff;
  auVar4._0_8_ = 0x3ff000003ff;
  auVar4._12_4_ = 0x3ff;
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 1) = auVar3._0_8_;
  uVar2 = in[1];
  out[3] = uVar1 >> 0x1e;
  out[3] = uVar1 >> 0x1e | (uVar2 & 0xff) << 2;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001ad340);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 4) = auVar3._0_8_;
  out[6] = uVar2 >> 0x1c;
  uVar1 = in[2];
  out[6] = uVar2 >> 0x1c | (uVar1 & 0x3f) << 4;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001ad3c0);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 7) = auVar3._0_8_;
  out[9] = uVar1 >> 0x1a;
  uVar2 = in[3];
  out[9] = uVar1 >> 0x1a | (uVar2 & 0xf) << 6;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001ad3d0);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 10) = auVar3._0_8_;
  uVar1 = in[4];
  out[0xc] = uVar2 >> 0x18;
  out[0xc] = uVar2 >> 0x18 | (uVar1 & 3) << 8;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001ad3e0);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 0xd) = auVar3._0_8_;
  out[0xf] = uVar1 >> 0x16;
  return in + 5;
}

Assistant:

const uint32_t *__fastunpack10_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 10);
  out++;
  *out = ((*in) >> 10) % (1U << 10);
  out++;
  *out = ((*in) >> 20) % (1U << 10);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 8)) << (10 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 10);
  out++;
  *out = ((*in) >> 18) % (1U << 10);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 6)) << (10 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 10);
  out++;
  *out = ((*in) >> 16) % (1U << 10);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 4)) << (10 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 10);
  out++;
  *out = ((*in) >> 14) % (1U << 10);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 2)) << (10 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 10);
  out++;
  *out = ((*in) >> 12) % (1U << 10);
  out++;
  *out = ((*in) >> 22);
  ++in;
  out++;

  return in;
}